

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::isCompInert(Normalizer2Impl *this,UChar32 c,UBool onlyContiguous)

{
  uint16_t uVar1;
  bool bVar2;
  
  uVar1 = getNorm16(this,c);
  if ((uVar1 & 1) == 0 || this->minNoNo <= uVar1) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar1 != 1 && onlyContiguous != '\0') {
      bVar2 = *(ushort *)((long)this->extraData + (ulong)(uVar1 & 0xfffe)) < 0x200;
    }
  }
  return bVar2;
}

Assistant:

UBool isCompInert(UChar32 c, UBool onlyContiguous) const {
        uint16_t norm16=getNorm16(c);
        return isCompYesAndZeroCC(norm16) &&
            (norm16 & HAS_COMP_BOUNDARY_AFTER) != 0 &&
            (!onlyContiguous || isInert(norm16) || *getMapping(norm16) <= 0x1ff);
    }